

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PosixFileMgr.cpp
# Opt level: O0

XMLFilePos __thiscall
xercesc_4_0::PosixFileMgr::curPos(PosixFileMgr *this,FileHandle f,MemoryManager *manager)

{
  XMLPlatformUtilsException *pXVar1;
  XMLFilePos XVar2;
  long curPos;
  MemoryManager *manager_local;
  FileHandle f_local;
  PosixFileMgr *this_local;
  
  if (f == (FileHandle)0x0) {
    pXVar1 = (XMLPlatformUtilsException *)__cxa_allocate_exception(0x30);
    XMLPlatformUtilsException::XMLPlatformUtilsException
              (pXVar1,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/FileManagers/PosixFileMgr.cpp"
               ,0x6e,CPtr_PointerIsZero,manager);
    __cxa_throw(pXVar1,&XMLPlatformUtilsException::typeinfo,
                XMLPlatformUtilsException::~XMLPlatformUtilsException);
  }
  XVar2 = ftell((FILE *)f);
  if (XVar2 == 0xffffffffffffffff) {
    pXVar1 = (XMLPlatformUtilsException *)__cxa_allocate_exception(0x30);
    XMLPlatformUtilsException::XMLPlatformUtilsException
              (pXVar1,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/FileManagers/PosixFileMgr.cpp"
               ,0x73,File_CouldNotGetSize,manager);
    __cxa_throw(pXVar1,&XMLPlatformUtilsException::typeinfo,
                XMLPlatformUtilsException::~XMLPlatformUtilsException);
  }
  return XVar2;
}

Assistant:

XMLFilePos
PosixFileMgr::curPos(FileHandle f, MemoryManager* const manager)
{
    if (!f)
        ThrowXMLwithMemMgr(XMLPlatformUtilsException, XMLExcepts::CPtr_PointerIsZero, manager);
		 
    long curPos = ftell((FILE*)f);
	
    if (curPos == -1)
        ThrowXMLwithMemMgr(XMLPlatformUtilsException, XMLExcepts::File_CouldNotGetSize, manager);

    return (XMLFilePos)curPos;
}